

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPStateImp.cpp
# Opt level: O2

void __thiscall TSPStateImp::~TSPStateImp(TSPStateImp *this)

{
  ~TSPStateImp(this);
  operator_delete(this);
  return;
}

Assistant:

TSPStateImp::~TSPStateImp()
{
	if (x != nullptr)
		delete x;
	if (y != nullptr)
		delete y;
	if (adjacencyMatrix != nullptr)
		delete adjacencyMatrix;
}